

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ze_parameter_validation.cpp
# Opt level: O3

ze_result_t __thiscall
validation_layer::ZEParameterValidation::zeMemGetAllocPropertiesPrologue
          (ZEParameterValidation *this,ze_context_handle_t hContext,void *ptr,
          ze_memory_allocation_properties_t *pMemAllocProperties,ze_device_handle_t *phDevice)

{
  ze_result_t zVar1;
  ze_result_t zVar2;
  
  zVar2 = ZE_RESULT_SUCCESS;
  if (pMemAllocProperties == (ze_memory_allocation_properties_t *)0x0) {
    zVar2 = ZE_RESULT_ERROR_INVALID_NULL_POINTER;
  }
  if (ptr == (void *)0x0) {
    zVar2 = ZE_RESULT_ERROR_INVALID_NULL_POINTER;
  }
  zVar1 = ZE_RESULT_ERROR_INVALID_NULL_HANDLE;
  if (hContext != (ze_context_handle_t)0x0) {
    zVar1 = zVar2;
  }
  return zVar1;
}

Assistant:

ze_result_t
    ZEParameterValidation::zeMemGetAllocPropertiesPrologue(
        ze_context_handle_t hContext,                   ///< [in] handle of the context object
        const void* ptr,                                ///< [in] memory pointer to query
        ze_memory_allocation_properties_t* pMemAllocProperties, ///< [in,out] query result for memory allocation properties
        ze_device_handle_t* phDevice                    ///< [out][optional] device associated with this allocation
        )
    {
        if( nullptr == hContext )
            return ZE_RESULT_ERROR_INVALID_NULL_HANDLE;

        if( nullptr == ptr )
            return ZE_RESULT_ERROR_INVALID_NULL_POINTER;

        if( nullptr == pMemAllocProperties )
            return ZE_RESULT_ERROR_INVALID_NULL_POINTER;

        return ParameterValidation::validateExtensions(pMemAllocProperties);
    }